

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFunctionBlocker.h
# Opt level: O1

void __thiscall cmFunctionBlocker::~cmFunctionBlocker(cmFunctionBlocker *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_cmFunctionBlocker = (_func_int **)&PTR___cxa_pure_virtual_00636800;
  pcVar1 = (this->StartingContext).FilePath._M_dataplus._M_p;
  paVar2 = &(this->StartingContext).FilePath.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->StartingContext).Name._M_dataplus._M_p;
  paVar2 = &(this->StartingContext).Name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~cmFunctionBlocker() = default;